

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int ltf8_decode(cram_fd *fd,int64_t *val_p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar1 = hgetc(fd->fp);
  if (uVar1 == 0xffffffff) {
    iVar2 = -1;
  }
  else {
    uVar9 = uVar1 & 0xff;
    uVar10 = (ulong)uVar9;
    if (uVar9 < 0x80) {
      iVar2 = 1;
    }
    else if (uVar9 < 0xc0) {
      uVar9 = hgetc(fd->fp);
      uVar10 = (ulong)((uVar1 & 0x3f) << 8 | uVar9 & 0xff);
      iVar2 = 2;
    }
    else if (uVar9 < 0xe0) {
      uVar9 = hgetc(fd->fp);
      uVar3 = hgetc(fd->fp);
      uVar10 = (ulong)((uVar1 & 0x1f) << 0x10 | (uVar9 & 0xff) << 8 | uVar3 & 0xff);
      iVar2 = 3;
    }
    else if (uVar9 < 0xf0) {
      uVar9 = hgetc(fd->fp);
      uVar3 = hgetc(fd->fp);
      uVar4 = hgetc(fd->fp);
      uVar10 = (ulong)((uVar3 & 0xff | (uVar9 & 0xff) << 8 | (uVar1 & 0xf) << 0x10) << 8 |
                      uVar4 & 0xff);
      iVar2 = 4;
    }
    else if (uVar9 < 0xf8) {
      uVar9 = hgetc(fd->fp);
      uVar3 = hgetc(fd->fp);
      uVar4 = hgetc(fd->fp);
      uVar5 = hgetc(fd->fp);
      uVar10 = (ulong)(uVar3 & 0xff | (uVar9 & 0xff) << 8 | (uVar1 & 7) << 0x10) << 0x10 |
               (ulong)((uVar4 & 0xff) << 8) | (ulong)(uVar5 & 0xff);
      iVar2 = 5;
    }
    else if (uVar9 < 0xfc) {
      uVar1 = hgetc(fd->fp);
      uVar3 = hgetc(fd->fp);
      uVar4 = hgetc(fd->fp);
      uVar5 = hgetc(fd->fp);
      uVar6 = hgetc(fd->fp);
      uVar10 = ((ulong)(uVar5 & 0xff) |
               (ulong)((uVar4 & 0xff) << 8) |
               ((ulong)(uVar3 & 0xff | (uVar1 & 0xff) << 8 | uVar9 << 0x10) & 0x3ffff) << 0x10) << 8
               | (ulong)(uVar6 & 0xff);
      iVar2 = 6;
    }
    else if (uVar9 < 0xfe) {
      uVar1 = hgetc(fd->fp);
      uVar3 = hgetc(fd->fp);
      uVar4 = hgetc(fd->fp);
      uVar5 = hgetc(fd->fp);
      uVar6 = hgetc(fd->fp);
      uVar7 = hgetc(fd->fp);
      uVar10 = ((ulong)(uVar5 & 0xff) |
               (ulong)((uVar4 & 0xff) << 8) |
               ((ulong)(uVar3 & 0xff | (uVar1 & 0xff) << 8 | uVar9 << 0x10) & 0x1ffff) << 0x10) <<
               0x10 | (ulong)((uVar6 & 0xff) << 8) | (ulong)(uVar7 & 0xff);
      iVar2 = 7;
    }
    else {
      uVar1 = hgetc(fd->fp);
      if (uVar9 == 0xff) {
        uVar9 = hgetc(fd->fp);
        uVar3 = hgetc(fd->fp);
        uVar4 = hgetc(fd->fp);
        uVar5 = hgetc(fd->fp);
        uVar6 = hgetc(fd->fp);
        uVar7 = hgetc(fd->fp);
        uVar8 = hgetc(fd->fp);
        uVar10 = (ulong)(uVar8 & 0xff) |
                 ((ulong)(uVar7 & 0xff) |
                 (ulong)((uVar6 & 0xff) << 8) |
                 ((ulong)(uVar5 & 0xff) |
                 (ulong)((uVar4 & 0xff) << 8) |
                 (ulong)(uVar3 & 0xff | (uVar9 & 0xff) << 8 | uVar1 << 0x10) << 0x10) << 0x10) << 8;
        iVar2 = 9;
      }
      else {
        uVar9 = hgetc(fd->fp);
        uVar3 = hgetc(fd->fp);
        uVar4 = hgetc(fd->fp);
        uVar5 = hgetc(fd->fp);
        uVar6 = hgetc(fd->fp);
        uVar7 = hgetc(fd->fp);
        uVar10 = ((ulong)(uVar5 & 0xff) |
                 (ulong)((uVar4 & 0xff) << 8) |
                 (ulong)(uVar3 & 0xff | (uVar9 & 0xff | (uVar1 & 0xff) << 8) << 8) << 0x10) << 0x10
                 | (ulong)((uVar6 & 0xff) << 8) | (ulong)(uVar7 & 0xff);
        iVar2 = 8;
      }
    }
    *val_p = uVar10;
  }
  return iVar2;
}

Assistant:

int ltf8_decode(cram_fd *fd, int64_t *val_p) {
    int c = hgetc(fd->fp);
    int64_t val = (unsigned char)c;
    if (c == -1)
	return -1;

    if (val < 0x80) {
	*val_p =   val;
	return 1;

    } else if (val < 0xc0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & (((1LL<<(6+8)))-1);
	return 2;

    } else if (val < 0xe0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(5+2*8))-1);
	return 3;

    } else if (val < 0xf0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(4+3*8))-1);
	return 4;

    } else if (val < 0xf8) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(3+4*8))-1);
	return 5;

    } else if (val < 0xfc) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(2+5*8))-1);
	return 6;

    } else if (val < 0xfe) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(1+6*8))-1);
	return 7;

    } else if (val < 0xff) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(7*8))-1);
	return 8;

    } else {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
    }

    return 9;
}